

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_do_gray_to_rgb(png_row_infop row_info,png_bytep row)

{
  byte bVar1;
  byte bVar2;
  png_bytep ppVar3;
  ulong uVar4;
  png_byte pVar5;
  png_byte *ppVar6;
  uint uVar7;
  ulong uVar8;
  
  bVar2 = row_info->bit_depth;
  if ((7 < bVar2) && (bVar1 = row_info->color_type, (bVar1 & 2) == 0)) {
    uVar7 = row_info->width;
    uVar4 = (ulong)uVar7;
    if (bVar1 == 4) {
      uVar8 = uVar4;
      if (bVar2 == 8) {
        while (uVar7 != 0) {
          row[uVar8 * 4 + -1] = row[uVar8 * 2 + -1];
          pVar5 = row[uVar8 * 2 + -2];
          row[uVar8 * 4 + -2] = pVar5;
          row[uVar8 * 4 + -3] = pVar5;
          row[uVar8 * 4 + -4] = row[uVar8 * 2 + -2];
          uVar7 = (uint)(uVar8 - 1);
          uVar8 = uVar8 - 1;
        }
      }
      else {
        while (uVar7 != 0) {
          row[uVar8 * 8 + -1] = row[uVar8 * 4 + -1];
          row[uVar8 * 8 + -2] = row[uVar8 * 4 + -2];
          row[uVar8 * 8 + -3] = row[uVar8 * 4 + -3];
          row[uVar8 * 8 + -4] = row[uVar8 * 4 + -4];
          row[uVar8 * 8 + -5] = row[uVar8 * 4 + -3];
          row[uVar8 * 8 + -6] = row[uVar8 * 4 + -4];
          row[uVar8 * 8 + -7] = row[uVar8 * 4 + -3];
          row[uVar8 * 8 + -8] = row[uVar8 * 4 + -4];
          uVar7 = (uint)(uVar8 - 1);
          uVar8 = uVar8 - 1;
        }
      }
    }
    else if (bVar1 == 0) {
      if (bVar2 == 8) {
        if (uVar7 != 0) {
          ppVar3 = row + uVar4;
          ppVar6 = row + uVar4 * 3 + -1;
          uVar8 = uVar4;
          do {
            ppVar3 = ppVar3 + -1;
            pVar5 = *ppVar3;
            *ppVar6 = pVar5;
            ppVar6[-1] = pVar5;
            ppVar6[-2] = *ppVar3;
            ppVar6 = ppVar6 + -3;
            uVar7 = (int)uVar8 - 1;
            uVar8 = (ulong)uVar7;
          } while (uVar7 != 0);
        }
      }
      else if (uVar7 != 0) {
        ppVar3 = row + uVar4 * 2 + -1;
        ppVar6 = row + uVar4 * 6 + -1;
        uVar8 = uVar4;
        do {
          *ppVar6 = *ppVar3;
          ppVar6[-1] = ppVar3[-1];
          ppVar6[-2] = *ppVar3;
          ppVar6[-3] = ppVar3[-1];
          ppVar6[-4] = *ppVar3;
          ppVar6[-5] = ppVar3[-1];
          ppVar6 = ppVar6 + -6;
          ppVar3 = ppVar3 + -2;
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
    }
    pVar5 = row_info->channels + '\x02';
    row_info->channels = pVar5;
    row_info->color_type = row_info->color_type | 2;
    bVar2 = row_info->bit_depth * pVar5;
    row_info->pixel_depth = bVar2;
    if (bVar2 < 8) {
      uVar4 = bVar2 * uVar4 + 7 >> 3;
    }
    else {
      uVar4 = (bVar2 >> 3) * uVar4;
    }
    row_info->rowbytes = uVar4;
  }
  return;
}

Assistant:

static void
png_do_gray_to_rgb(png_row_infop row_info, png_bytep row)
{
   png_uint_32 i;
   png_uint_32 row_width = row_info->width;

   png_debug(1, "in png_do_gray_to_rgb");

   if (row_info->bit_depth >= 8 &&
       (row_info->color_type & PNG_COLOR_MASK_COLOR) == 0)
   {
      if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
      {
         if (row_info->bit_depth == 8)
         {
            /* This changes G to RGB */
            png_bytep sp = row + (size_t)row_width - 1;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *sp;
               *(dp--) = *sp;
               *(dp--) = *(sp--);
            }
         }

         else
         {
            /* This changes GG to RRGGBB */
            png_bytep sp = row + (size_t)row_width * 2 - 1;
            png_bytep dp = sp  + (size_t)row_width * 4;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
            }
         }
      }

      else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
      {
         if (row_info->bit_depth == 8)
         {
            /* This changes GA to RGBA */
            png_bytep sp = row + (size_t)row_width * 2 - 1;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *(sp--);
               *(dp--) = *sp;
               *(dp--) = *sp;
               *(dp--) = *(sp--);
            }
         }

         else
         {
            /* This changes GGAA to RRGGBBAA */
            png_bytep sp = row + (size_t)row_width * 4 - 1;
            png_bytep dp = sp  + (size_t)row_width * 4;
            for (i = 0; i < row_width; i++)
            {
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *sp;
               *(dp--) = *(sp - 1);
               *(dp--) = *(sp--);
               *(dp--) = *(sp--);
            }
         }
      }
      row_info->channels = (png_byte)(row_info->channels + 2);
      row_info->color_type |= PNG_COLOR_MASK_COLOR;
      row_info->pixel_depth = (png_byte)(row_info->channels *
          row_info->bit_depth);
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_width);
   }
}